

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

void AdjustMeshPeriodicTextureCoordinatesHelper
               (ON_Mesh *mesh,ON_Xform *mesh_xform,float *mesh_T,int mesh_T_stride,int *Tsd,
               double two_pi_tc,ON_TextureMapping *mapping)

{
  float *pfVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  void *pvVar6;
  ON_MeshFace *pOVar7;
  ON__CMeshFaceTC *pOVar8;
  float fVar9;
  float fVar10;
  uint local_1f0;
  float local_1e8;
  float local_1e4;
  uint local_1e0;
  float local_1d8;
  float local_1d4;
  uint local_1d0;
  float local_1c8;
  float local_1c4;
  float local_1c0;
  float local_1b8;
  float local_1b4;
  bool local_18e;
  bool local_18d;
  int *meshFvi;
  ON__CMeshFaceTC *ftc_local_1;
  ON__CChangeTextureCoordinateHelper helper;
  ON__CMeshFaceTC *ftc_local;
  int local_110;
  int newvcnt;
  int ftci;
  float twopitc;
  float f1;
  float f0;
  int k;
  float t1;
  float t0;
  ON__CMeshFaceTC ftc;
  int fi;
  int *Fvi;
  ON_MeshFace *F;
  ON_SimpleArray<ON__CMeshFaceTC> ftc_list;
  float ang1;
  float ang0;
  int ftc_count;
  int q;
  int ti;
  int vi;
  float t;
  float *Tx;
  int *quad;
  ON_Workspace ws;
  bool bBoxCheck;
  bool bCylinderCheck;
  bool bSphereCheck;
  TYPE mapping_type;
  int fcnt;
  int vcnt;
  ON_TextureMapping *mapping_local;
  double two_pi_tc_local;
  int *Tsd_local;
  float *pfStack_20;
  int mesh_T_stride_local;
  float *mesh_T_local;
  ON_Xform *mesh_xform_local;
  ON_Mesh *mesh_local;
  
  pfStack_20 = mesh_T;
  mesh_T_local = (float *)mesh_xform;
  mesh_xform_local = (ON_Xform *)mesh;
  iVar2 = ON_SimpleArray<ON_3fPoint>::Count(&(mesh->m_V).super_ON_SimpleArray<ON_3fPoint>);
  iVar3 = ON_SimpleArray<ON_MeshFace>::Count
                    ((ON_SimpleArray<ON_MeshFace> *)(mesh_xform_local->m_xform + 2));
  if (((2 < iVar2) && (0 < iVar3)) &&
     (iVar4 = ON_SimpleArray<ON_2fPoint>::Count
                        ((ON_SimpleArray<ON_2fPoint> *)(mesh_xform_local[3].m_xform[3] + 3)),
     iVar2 == iVar4)) {
    ws.m_pMemBlk._4_4_ = mapping->m_type;
    ws.m_pMemBlk._3_1_ = ws.m_pMemBlk._4_4_ == sphere_mapping;
    local_18d = Tsd != (int *)0x0 && ws.m_pMemBlk._4_4_ == cylinder_mapping;
    ws.m_pMemBlk._2_1_ = local_18d;
    local_18e = Tsd != (int *)0x0 && ws.m_pMemBlk._4_4_ == box_mapping;
    ws.m_pMemBlk._1_1_ = local_18e;
    if ((Tsd != (int *)0x0 && ws.m_pMemBlk._4_4_ == box_mapping) &&
       (mapping->m_texture_space == single)) {
      AdjustSingleBoxTextureCoordinatesHelper
                ((ON_Mesh *)mesh_xform_local,(ON_Xform *)mesh_T_local,pfStack_20,mesh_T_stride,Tsd,
                 mapping);
    }
    else {
      ON_Workspace::ON_Workspace((ON_Workspace *)&quad);
      piVar5 = ON_Workspace::GetIntMemory((ON_Workspace *)&quad,(long)iVar2);
      pvVar6 = ON_Workspace::GetMemory((ON_Workspace *)&quad,(long)iVar2 << 2);
      ang0 = 0.0;
      ang1 = 0.0;
      fVar9 = (float)(two_pi_tc * 0.25);
      ftc_list.m_capacity = (int)(float)(two_pi_tc * 0.75);
      ftc_count = 0;
      for (q = 0; q < iVar2; q = q + 1) {
        piVar5[q] = 0;
        *(float *)((long)pvVar6 + (long)q * 4) = pfStack_20[ftc_count];
        if ((ws.m_pMemBlk._2_1_ & 1) == 0) {
          if ((ws.m_pMemBlk._1_1_ & 1) != 0) {
            if ((Tsd[q] != 1) && (Tsd[q] != 3)) goto LAB_006ce334;
            goto LAB_006ce2a2;
          }
          if ((ws.m_pMemBlk._3_1_ & 1) == 0) goto LAB_006ce2a2;
          if (0.001 <= pfStack_20[ftc_count + 1]) {
            if (pfStack_20[ftc_count + 1] <= 0.999) goto LAB_006ce2a2;
            piVar5[q] = 8;
            ang0 = (float)((uint)ang0 | 8);
            ang1 = (float)((int)ang1 + 1);
          }
          else {
            piVar5[q] = 8;
            ang0 = (float)((uint)ang0 | 8);
            ang1 = (float)((int)ang1 + 1);
          }
        }
        else {
          if (Tsd[q] != 1) goto LAB_006ce334;
LAB_006ce2a2:
          fVar10 = *(float *)((long)pvVar6 + (long)q * 4);
          if (fVar9 <= fVar10) {
            if ((float)ftc_list.m_capacity < fVar10) {
              piVar5[q] = 4;
              ang0 = (float)((uint)ang0 | 4);
              ang1 = (float)((int)ang1 + 1);
            }
          }
          else {
            piVar5[q] = 1;
            ang0 = (float)((uint)ang0 | 1);
            ang1 = (float)((int)ang1 + 1);
          }
        }
LAB_006ce334:
        ftc_count = mesh_T_stride + ftc_count;
      }
      if (((ang0 == 0.0) || (ang0 == 1.4013e-45)) || (ang0 == 5.60519e-45)) {
        ftc_list.m_count = 1;
      }
      else {
        ON_SimpleArray<ON__CMeshFaceTC>::ON_SimpleArray
                  ((ON_SimpleArray<ON__CMeshFaceTC> *)&F,(long)((int)ang1 * 4 + 0x80));
        pOVar7 = ON_SimpleArray<ON_MeshFace>::Array
                           ((ON_SimpleArray<ON_MeshFace> *)(mesh_xform_local->m_xform + 2));
        memset(&t1,0,0x28);
        for (ftc.Tx[3] = 0.0; (int)ftc.Tx[3] < iVar3; ftc.Tx[3] = (float)((int)ftc.Tx[3] + 1)) {
          register0x00000000 = pOVar7 + (int)ftc.Tx[3];
          t0 = (float)piVar5[register0x00000000->vi[0]];
          ftc.fi = piVar5[register0x00000000->vi[1]];
          ftc.quad[0] = piVar5[register0x00000000->vi[2]];
          ftc.quad[1] = piVar5[register0x00000000->vi[3]];
          ang0 = (float)((uint)t0 | ftc.fi | piVar5[register0x00000000->vi[2]] | ftc.quad[1]);
          if (((ang0 != 0.0) && (ang0 != 1.4013e-45)) && (ang0 != 5.60519e-45)) {
            t1 = -NAN;
            ftc.quad[2] = *(int *)((long)pvVar6 + (long)register0x00000000->vi[0] * 4);
            local_1b8 = *(float *)((long)pvVar6 + (long)register0x00000000->vi[1] * 4);
            ftc.quad[3] = (int)local_1b8;
            ftc.Tx[0] = *(float *)((long)pvVar6 + (long)register0x00000000->vi[2] * 4);
            local_1b4 = *(float *)((long)pvVar6 + (long)register0x00000000->vi[3] * 4);
            ftc.Tx[1] = local_1b4;
            if (((uint)ang0 & 8) != 0) {
              if (t0 == 1.12104e-44) {
                if (ftc.quad[1] == 8) {
                  local_1b4 = -1.234321e+38;
                }
                if (ftc.fi == 8) {
                  local_1b8 = -1.234321e+38;
                }
                if (((local_1b4 != -1.234321e+38) || (NAN(local_1b4))) ||
                   ((local_1b8 != -1.234321e+38 || (NAN(local_1b8))))) {
                  ftc.quad[2] = (int)PoleFix(local_1b4,local_1b8);
                  if (fVar9 <= (float)ftc.quad[2]) {
                    local_1c0 = 0.0;
                    if ((float)ftc_list.m_capacity < (float)ftc.quad[2]) {
                      local_1c0 = 5.60519e-45;
                    }
                  }
                  else {
                    local_1c0 = 1.4013e-45;
                  }
                  t0 = local_1c0;
                  ang0 = (float)((uint)local_1c0 | (uint)ang0);
                  t1 = ftc.Tx[3];
                }
              }
              if (ftc.fi == 8) {
                if (t0 == 1.12104e-44) {
                  local_1c4 = -1.234321e+38;
                }
                else {
                  local_1c4 = (float)ftc.quad[2];
                }
                if (ftc.quad[0] == 8) {
                  local_1c8 = -1.234321e+38;
                }
                else {
                  local_1c8 = ftc.Tx[0];
                }
                if ((((local_1c4 != -1.234321e+38) || (NAN(local_1c4))) ||
                    (local_1c8 != -1.234321e+38)) || (NAN(local_1c8))) {
                  ftc.quad[3] = (int)PoleFix(local_1c4,local_1c8);
                  if (fVar9 <= (float)ftc.quad[3]) {
                    local_1d0 = 0;
                    if ((float)ftc_list.m_capacity < (float)ftc.quad[3]) {
                      local_1d0 = 4;
                    }
                  }
                  else {
                    local_1d0 = 1;
                  }
                  ftc.fi = local_1d0;
                  ang0 = (float)(local_1d0 | (uint)ang0);
                  t1 = ftc.Tx[3];
                }
              }
              if (ftc.quad[0] == 8) {
                iVar2 = 3;
                if (stack0xffffffffffffff38->vi[2] == stack0xffffffffffffff38->vi[3]) {
                  iVar2 = 0;
                }
                if (ftc.fi == 8) {
                  local_1d4 = -1.234321e+38;
                }
                else {
                  local_1d4 = (float)ftc.quad[3];
                }
                if (ftc.quad[(long)iVar2 + -2] == 8) {
                  local_1d8 = -1.234321e+38;
                }
                else {
                  local_1d8 = (float)ftc.quad[(long)iVar2 + 2];
                }
                if (((local_1d4 != -1.234321e+38) || (NAN(local_1d4))) ||
                   ((local_1d8 != -1.234321e+38 || (NAN(local_1d8))))) {
                  ftc.Tx[0] = PoleFix(local_1d4,local_1d8);
                  if (fVar9 <= ftc.Tx[0]) {
                    local_1e0 = 0;
                    if ((float)ftc_list.m_capacity < ftc.Tx[0]) {
                      local_1e0 = 4;
                    }
                  }
                  else {
                    local_1e0 = 1;
                  }
                  ftc.quad[0] = local_1e0;
                  if (iVar2 == 0) {
                    ftc.quad[1] = local_1e0;
                    ftc.Tx[1] = ftc.Tx[0];
                  }
                  ang0 = (float)(local_1e0 | (uint)ang0);
                  t1 = ftc.Tx[3];
                }
              }
              if ((ftc.quad[1] == 8) &&
                 (stack0xffffffffffffff38->vi[2] != stack0xffffffffffffff38->vi[3])) {
                if (ftc.quad[0] == 8) {
                  local_1e4 = -1.234321e+38;
                }
                else {
                  local_1e4 = ftc.Tx[0];
                }
                if (t0 == 1.12104e-44) {
                  local_1e8 = -1.234321e+38;
                }
                else {
                  local_1e8 = (float)ftc.quad[2];
                }
                if ((((local_1e4 != -1.234321e+38) || (NAN(local_1e4))) ||
                    (local_1e8 != -1.234321e+38)) || (NAN(local_1e8))) {
                  ftc.Tx[1] = PoleFix(local_1e4,local_1e8);
                  if (fVar9 <= ftc.Tx[1]) {
                    local_1f0 = 0;
                    if ((float)ftc_list.m_capacity < ftc.Tx[1]) {
                      local_1f0 = 4;
                    }
                  }
                  else {
                    local_1f0 = 1;
                  }
                  ftc.quad[1] = local_1f0;
                  ang0 = (float)(local_1f0 | (uint)ang0);
                  t1 = ftc.Tx[3];
                }
              }
            }
            if (((uint)ang0 & 5) == 5) {
              if ((two_pi_tc != 1.0) || (NAN(two_pi_tc))) {
                twopitc = 0.0;
                ftci = 0;
                fVar10 = (float)two_pi_tc;
                if (t0 == 1.4013e-45) {
                  twopitc = (float)ftc.quad[2] + 0.0;
                }
                else if (t0 == 5.60519e-45) {
                  ftci = (int)((fVar10 - (float)ftc.quad[2]) + 0.0);
                }
                if (ftc.fi == 1) {
                  twopitc = (float)ftc.quad[3] + twopitc;
                }
                else if (ftc.fi == 4) {
                  ftci = (int)((fVar10 - (float)ftc.quad[3]) + (float)ftci);
                }
                if (ftc.quad[0] == 1) {
                  twopitc = ftc.Tx[0] + twopitc;
                }
                else if (ftc.quad[0] == 4) {
                  ftci = (int)((fVar10 - ftc.Tx[0]) + (float)ftci);
                }
                if (stack0xffffffffffffff38->vi[2] != stack0xffffffffffffff38->vi[3]) {
                  if (ftc.quad[1] == 1) {
                    twopitc = ftc.Tx[1] + twopitc;
                  }
                  else if (ftc.quad[1] == 4) {
                    ftci = (int)((fVar10 - ftc.Tx[1]) + (float)ftci);
                  }
                }
                if (twopitc < (float)ftci) {
                  if (t0 == 1.4013e-45) {
                    t1 = ftc.Tx[3];
                    ftc.quad[2] = (int)fVar10;
                  }
                  if (ftc.fi == 1) {
                    t1 = ftc.Tx[3];
                    ftc.quad[3] = (int)fVar10;
                  }
                  if (ftc.quad[0] == 1) {
                    t1 = ftc.Tx[3];
                    ftc.Tx[0] = fVar10;
                  }
                  if (ftc.quad[1] == 1) {
                    t1 = ftc.Tx[3];
                    ftc.Tx[1] = fVar10;
                  }
                }
                else {
                  if (t0 == 5.60519e-45) {
                    ftc.quad[2] = 0;
                    t1 = ftc.Tx[3];
                  }
                  if (ftc.fi == 4) {
                    ftc.quad[3] = 0;
                    t1 = ftc.Tx[3];
                  }
                  if (ftc.quad[0] == 4) {
                    ftc.Tx[0] = 0.0;
                    t1 = ftc.Tx[3];
                  }
                  if (ftc.quad[1] == 4) {
                    ftc.Tx[1] = 0.0;
                    t1 = ftc.Tx[3];
                  }
                }
              }
              else {
                if (t0 == 1.4013e-45) {
                  ftc.quad[2] = (int)((float)ftc.quad[2] + 1.0);
                  t1 = ftc.Tx[3];
                }
                if (ftc.fi == 1) {
                  ftc.quad[3] = (int)((float)ftc.quad[3] + 1.0);
                  t1 = ftc.Tx[3];
                }
                if (ftc.quad[0] == 1) {
                  ftc.Tx[0] = ftc.Tx[0] + 1.0;
                  t1 = ftc.Tx[3];
                }
                if (ftc.quad[1] == 1) {
                  ftc.Tx[1] = ftc.Tx[1] + 1.0;
                  t1 = ftc.Tx[3];
                }
              }
            }
            if (-1 < (int)t1) {
              ON_SimpleArray<ON__CMeshFaceTC>::Append
                        ((ON_SimpleArray<ON__CMeshFaceTC> *)&F,(ON__CMeshFaceTC *)&t1);
            }
          }
        }
        iVar2 = ON_SimpleArray<ON__CMeshFaceTC>::Count((ON_SimpleArray<ON__CMeshFaceTC> *)&F);
        if (iVar2 < 1) {
          ftc_list.m_count = 1;
        }
        else {
          ftc_local._4_4_ = 0;
          for (local_110 = 0; local_110 < iVar2; local_110 = local_110 + 1) {
            helper.m_vuse._16_8_ =
                 ON_SimpleArray<ON__CMeshFaceTC>::operator[]
                           ((ON_SimpleArray<ON__CMeshFaceTC> *)&F,local_110);
            register0x00000000 = pOVar7 + ((ON__CMeshFaceTC *)helper.m_vuse._16_8_)->fi;
            pfVar1 = (float *)((long)pvVar6 + (long)register0x00000000->vi[0] * 4);
            if ((((ON__CMeshFaceTC *)helper.m_vuse._16_8_)->Tx[0] != *pfVar1) ||
               (NAN(((ON__CMeshFaceTC *)helper.m_vuse._16_8_)->Tx[0]) || NAN(*pfVar1))) {
              ((ON__CMeshFaceTC *)helper.m_vuse._16_8_)->bSetT[0] = true;
              ftc_local._4_4_ = ftc_local._4_4_ + 1;
            }
            pfVar1 = (float *)((long)pvVar6 + (long)register0x00000000->vi[1] * 4);
            if ((((ON__CMeshFaceTC *)helper.m_vuse._16_8_)->Tx[1] != *pfVar1) ||
               (NAN(((ON__CMeshFaceTC *)helper.m_vuse._16_8_)->Tx[1]) || NAN(*pfVar1))) {
              ((ON__CMeshFaceTC *)helper.m_vuse._16_8_)->bSetT[1] = true;
              ftc_local._4_4_ = ftc_local._4_4_ + 1;
            }
            pfVar1 = (float *)((long)pvVar6 + (long)register0x00000000->vi[2] * 4);
            if ((((ON__CMeshFaceTC *)helper.m_vuse._16_8_)->Tx[2] != *pfVar1) ||
               (NAN(((ON__CMeshFaceTC *)helper.m_vuse._16_8_)->Tx[2]) || NAN(*pfVar1))) {
              ((ON__CMeshFaceTC *)helper.m_vuse._16_8_)->bSetT[2] = true;
              ftc_local._4_4_ = ftc_local._4_4_ + 1;
            }
            if ((register0x00000000->vi[2] != register0x00000000->vi[3]) &&
               ((pfVar1 = (float *)((long)pvVar6 + (long)register0x00000000->vi[3] * 4),
                ((ON__CMeshFaceTC *)helper.m_vuse._16_8_)->Tx[3] != *pfVar1 ||
                (NAN(((ON__CMeshFaceTC *)helper.m_vuse._16_8_)->Tx[3]) || NAN(*pfVar1))))) {
              ((ON__CMeshFaceTC *)helper.m_vuse._16_8_)->bSetT[3] = true;
              ftc_local._4_4_ = ftc_local._4_4_ + 1;
            }
          }
          if (ftc_local._4_4_ < 1) {
            ftc_list.m_count = 1;
          }
          else {
            ON__CChangeTextureCoordinateHelper::ON__CChangeTextureCoordinateHelper
                      ((ON__CChangeTextureCoordinateHelper *)&ftc_local_1,
                       (ON_Mesh *)mesh_xform_local,ftc_local._4_4_,&stack0xffffffffffffffe0);
            for (local_110 = 0; local_110 < iVar2; local_110 = local_110 + 1) {
              pOVar8 = ON_SimpleArray<ON__CMeshFaceTC>::operator[]
                                 ((ON_SimpleArray<ON__CMeshFaceTC> *)&F,local_110);
              pOVar7 = ON_SimpleArray<ON_MeshFace>::operator[]
                                 ((ON_SimpleArray<ON_MeshFace> *)(mesh_xform_local->m_xform + 2),
                                  pOVar8->fi);
              if ((pOVar8->bSetT[0] & 1U) != 0) {
                ON__CChangeTextureCoordinateHelper::ChangeTextureCoordinate
                          ((ON__CChangeTextureCoordinateHelper *)&ftc_local_1,pOVar7->vi,0,
                           pOVar8->Tx[0],-1.234321e+38,pfStack_20,mesh_T_stride);
              }
              if ((pOVar8->bSetT[1] & 1U) != 0) {
                ON__CChangeTextureCoordinateHelper::ChangeTextureCoordinate
                          ((ON__CChangeTextureCoordinateHelper *)&ftc_local_1,pOVar7->vi,1,
                           pOVar8->Tx[1],-1.234321e+38,pfStack_20,mesh_T_stride);
              }
              if ((pOVar8->bSetT[2] & 1U) != 0) {
                ON__CChangeTextureCoordinateHelper::ChangeTextureCoordinate
                          ((ON__CChangeTextureCoordinateHelper *)&ftc_local_1,pOVar7->vi,2,
                           pOVar8->Tx[2],-1.234321e+38,pfStack_20,mesh_T_stride);
              }
              if ((pOVar8->bSetT[3] & 1U) != 0) {
                ON__CChangeTextureCoordinateHelper::ChangeTextureCoordinate
                          ((ON__CChangeTextureCoordinateHelper *)&ftc_local_1,pOVar7->vi,3,
                           pOVar8->Tx[3],-1.234321e+38,pfStack_20,mesh_T_stride);
              }
            }
            ON__CChangeTextureCoordinateHelper::~ON__CChangeTextureCoordinateHelper
                      ((ON__CChangeTextureCoordinateHelper *)&ftc_local_1);
            ftc_list.m_count = 0;
          }
        }
        ON_SimpleArray<ON__CMeshFaceTC>::~ON_SimpleArray((ON_SimpleArray<ON__CMeshFaceTC> *)&F);
      }
      ON_Workspace::~ON_Workspace((ON_Workspace *)&quad);
    }
  }
  return;
}

Assistant:

static
void AdjustMeshPeriodicTextureCoordinatesHelper(
          ON_Mesh& mesh,
          const ON_Xform* mesh_xform,
          float* mesh_T,
          int    mesh_T_stride,
          const int* Tsd,
          double two_pi_tc,
          const ON_TextureMapping& mapping
          )
{
  // This helper adjusts texture coordinates on faces that
  // span the seam on mapping spheres and cylinders and
  // resolves the multiple valued problem that
  // exists at the poles of sphere mappings.

  const int vcnt = mesh.m_V.Count();
  const int fcnt = mesh.m_F.Count();
  if ( vcnt < 3 || fcnt < 1 || vcnt != mesh.m_T.Count() )
    return;

  // see if any texture coordinate adjustment is necessary
  const ON_TextureMapping::TYPE mapping_type = mapping.m_type;
  const bool bSphereCheck = ( ON_TextureMapping::TYPE::sphere_mapping == mapping_type );
  const bool bCylinderCheck = (Tsd && ON_TextureMapping::TYPE::cylinder_mapping == mapping_type);
  const bool bBoxCheck = (Tsd && ON_TextureMapping::TYPE::box_mapping == mapping_type);

  if ( bBoxCheck && ON_TextureMapping::TEXTURE_SPACE::single == mapping.m_texture_space )
  {
    AdjustSingleBoxTextureCoordinatesHelper( mesh, mesh_xform, mesh_T, mesh_T_stride, Tsd, mapping );
    return;
  }

  ON_Workspace ws;
  int* quad = ws.GetIntMemory(vcnt); // ~ws will free quad memory
  float* Tx = (float*)ws.GetMemory(vcnt*sizeof(Tx[0]));
  float t;
  int vi, ti, q=0;
  int ftc_count = 0;

  const float ang0 = (float)(0.25*two_pi_tc);
  const float ang1 = (float)(0.75*two_pi_tc);


  for ( vi = ti = 0; vi < vcnt; vi++, ti += mesh_T_stride )
  {
    quad[vi] = 0;
    Tx[vi] = mesh_T[ti];
    if ( bCylinderCheck )
    {
      if ( 1 != Tsd[vi] )
        continue;
    }
    else if ( bBoxCheck )
    {
      if ( 1 != Tsd[vi] && 3 != Tsd[vi] )
        continue;
    }
    else if ( bSphereCheck )
    {
      t = mesh_T[ti+1]; // t = "v" texture coordinate
      if ( t < 0.001f )
      {
        quad[vi] = 8; q |= 8; // south pole point
        ftc_count++;
        continue;
      }
      if ( t > 0.999f )
      {
        quad[vi] = 8; q |= 8; // north pole point
        ftc_count++;
        continue;
      }
    }

    t = Tx[vi]; // t = "u" texture coordinate
    if ( t < ang0 )
    {
      quad[vi] = 1; q |= 1; // longitude < pi/2
      ftc_count++;
    }
    else if ( t > ang1 )
    {
      quad[vi] = 4; q |= 4; // longitude > 3pi/2
      ftc_count++;
    }
  }

  if ( 0 == q || 1 == q || 4 == q )
  {
    // nothing needs to be adjusted
    return;
  }

  // 4*ftc_count = (over) estimate of the number of faces that
  // will be changed.
  ON_SimpleArray<ON__CMeshFaceTC> ftc_list(ftc_count*4 + 128);
  ftc_count = 0;
  const ON_MeshFace* F = mesh.m_F.Array();
  const int* Fvi;
  int fi;
  ON__CMeshFaceTC ftc;
  memset(&ftc,0,sizeof(ftc));
  float t0, t1;

  for ( fi = 0; fi < fcnt; fi++ )
  {
    Fvi = F[fi].vi;

    ftc.quad[0] = quad[Fvi[0]];
    ftc.quad[1] = quad[Fvi[1]];
    ftc.quad[2] = quad[Fvi[2]];
    ftc.quad[3] = quad[Fvi[3]];

    q = (ftc.quad[0] | ftc.quad[1] | ftc.quad[2] | ftc.quad[3]);
    if ( 0 == q || 1 == q || 4 == q )
    {
      // no adjustments need to be made
      continue;
    }

    // ftc.fi will be set to fi if a texture coordinate needs to be adjusted
    ftc.fi = -1;

    ftc.Tx[0] = Tx[Fvi[0]];
    ftc.Tx[1] = Tx[Fvi[1]];
    ftc.Tx[2] = Tx[Fvi[2]];
    ftc.Tx[3] = Tx[Fvi[3]];

    if ( 0 != (8&q) )
    {
      // see if check for north/south sphere mapping poles and fix them
      if ( 8 == ftc.quad[0] )
      {
        t0 = (8 == ftc.quad[3]) ? ON_UNSET_FLOAT : ftc.Tx[3];
        t1 = (8 == ftc.quad[1]) ? ON_UNSET_FLOAT : ftc.Tx[1];
        if ( ON_UNSET_FLOAT != t0 || ON_UNSET_FLOAT != t1 )
        {
          ftc.Tx[0] = PoleFix(t0,t1);
          ftc.quad[0] = ((ftc.Tx[0] < ang0) ? 1 : ((ftc.Tx[0] > ang1) ? 4 : 0));
          q |= ftc.quad[0];
          ftc.fi = fi;
        }
      }
      if ( 8 == ftc.quad[1] )
      {
        t0 = (8 == ftc.quad[0]) ? ON_UNSET_FLOAT : ftc.Tx[0];
        t1 = (8 == ftc.quad[2]) ? ON_UNSET_FLOAT : ftc.Tx[2];
        if ( ON_UNSET_FLOAT != t0 || ON_UNSET_FLOAT != t1 )
        {
          ftc.Tx[1] = PoleFix(t0,t1);
          ftc.quad[1] = ((ftc.Tx[1] < ang0) ? 1 : ((ftc.Tx[1] > ang1) ? 4 : 0));
          q |= ftc.quad[1];
          ftc.fi = fi;
        }
      }
      if ( 8 == ftc.quad[2] )
      {
        int k = (Fvi[2] == Fvi[3]) ? 0 : 3;
        t0 = (8 == ftc.quad[1]) ? ON_UNSET_FLOAT : ftc.Tx[1];
        t1 = (8 == ftc.quad[k]) ? ON_UNSET_FLOAT : ftc.Tx[k];
        if ( ON_UNSET_FLOAT != t0 || ON_UNSET_FLOAT != t1 )
        {
          ftc.Tx[2] = PoleFix(t0,t1);
          ftc.quad[2] = ((ftc.Tx[2] < ang0) ? 1 : ((ftc.Tx[2] > ang1) ? 4 : 0));
          if ( !k )
          {
            ftc.Tx[3] = ftc.Tx[2];
            ftc.quad[3] = ftc.quad[2];
          }
          q |= ftc.quad[2];
          ftc.fi = fi;
        }
      }
      if ( 8 == ftc.quad[3] && Fvi[2] != Fvi[3] )
      {
        t0 = (8 == ftc.quad[2]) ? ON_UNSET_FLOAT : ftc.Tx[2];
        t1 = (8 == ftc.quad[0]) ? ON_UNSET_FLOAT : ftc.Tx[0];
        if ( ON_UNSET_FLOAT != t0 || ON_UNSET_FLOAT != t1 )
        {
          ftc.Tx[3] = PoleFix(t0,t1);
          ftc.quad[3] = ((ftc.Tx[3] < ang0) ? 1 : ((ftc.Tx[3] > ang1) ? 4 : 0));
          q |= ftc.quad[3];
          ftc.fi = fi;
        }
      }
    }

    if ( 5 == (5&q) )
    {
      // The face has corners on both sides of the seam
      if ( two_pi_tc == 1.0 )
      {
        if ( 1 == ftc.quad[0] ) {ftc.Tx[0] += 1.0f; ftc.fi = fi;}
        if ( 1 == ftc.quad[1] ) {ftc.Tx[1] += 1.0f; ftc.fi = fi;}
        if ( 1 == ftc.quad[2] ) {ftc.Tx[2] += 1.0f; ftc.fi = fi;}
        if ( 1 == ftc.quad[3] ) {ftc.Tx[3] += 1.0f; ftc.fi = fi;}
      }
      else
      {
        // With divided textures, wrapping the texture coordinate
        // does not work because it wraps into a region of the
        // texture not use by this "side".  In this case, the
        // only thing to do is to pick the best end of the texture
        // map and clamp the tcs that hang over.  If the mesh
        // has edges near the texture seam, the picture will
        // still look ok.
        float f0=0.0f, f1=0.0f, twopitc = (float)two_pi_tc;
        //int f0cnt=0, f1cnt=0;
        if ( 1 == ftc.quad[0] ) f0 += ftc.Tx[0]; else if ( 4 == ftc.quad[0] ) f1 += twopitc-ftc.Tx[0];
        if ( 1 == ftc.quad[1] ) f0 += ftc.Tx[1]; else if ( 4 == ftc.quad[1] ) f1 += twopitc-ftc.Tx[1];
        if ( 1 == ftc.quad[2] ) f0 += ftc.Tx[2]; else if ( 4 == ftc.quad[2] ) f1 += twopitc-ftc.Tx[2];
        if (Fvi[2] != Fvi[3])
        {
          if ( 1 == ftc.quad[3] ) f0 += ftc.Tx[3]; else if ( 4 == ftc.quad[3] ) f1 += twopitc-ftc.Tx[3];
        }
        if (f0 >= f1 )
        {
          // "most" of the face is on the left side of the texture
          // If a vertex is on the right side, clamp its tc to 0.
          if ( 4 == ftc.quad[0] ) {ftc.Tx[0] = 0.0f; ftc.fi = fi;}
          if ( 4 == ftc.quad[1] ) {ftc.Tx[1] = 0.0f; ftc.fi = fi;}
          if ( 4 == ftc.quad[2] ) {ftc.Tx[2] = 0.0f; ftc.fi = fi;}
          if ( 4 == ftc.quad[3] ) {ftc.Tx[3] = 0.0f; ftc.fi = fi;}
        }
        else
        {
          // "most" of the face is on the right side of the texture
          // If a vertex is on the left side, clamp its tc to two_pi_tc.
          if ( 1 == ftc.quad[0] ) {ftc.Tx[0] = twopitc; ftc.fi = fi;}
          if ( 1 == ftc.quad[1] ) {ftc.Tx[1] = twopitc; ftc.fi = fi;}
          if ( 1 == ftc.quad[2] ) {ftc.Tx[2] = twopitc; ftc.fi = fi;}
          if ( 1 == ftc.quad[3] ) {ftc.Tx[3] = twopitc; ftc.fi = fi;}
        }
      }
    }

    if ( ftc.fi >= 0 )
    {
      // face will require special handling
      ftc_list.Append(ftc);
    }
  }

  ftc_count = ftc_list.Count();
  if ( ftc_count <= 0 )
    return;

  // Count the number of new vertices that will be added.
  int ftci;
  int newvcnt = 0;
  for ( ftci = 0; ftci < ftc_count; ftci++ )
  {
    ON__CMeshFaceTC& ftc_local = ftc_list[ftci];
    Fvi = F[ftc_local.fi].vi;
    if ( ftc_local.Tx[0] != Tx[Fvi[0]] )
    {
      ftc_local.bSetT[0] = true;
      newvcnt++;
    }
    if ( ftc_local.Tx[1] != Tx[Fvi[1]] )
    {
      ftc_local.bSetT[1] = true;
      newvcnt++;
    }
    if ( ftc_local.Tx[2] != Tx[Fvi[2]] )
    {
      ftc_local.bSetT[2] = true;
      newvcnt++;
    }
    if ( Fvi[2] != Fvi[3] )
    {
      if ( ftc_local.Tx[3] != Tx[Fvi[3]] )
      {
        ftc_local.bSetT[3] = true;
        newvcnt++;
      }
    }
  }

  if ( newvcnt <= 0 )
    return;


  F = 0; // Setting them to nullptr makes sure anybody who
         // tries to use them below will crash.

  // reserve room for new vertex information
  ON__CChangeTextureCoordinateHelper helper(mesh,newvcnt,mesh_T);

  // add vertices and update mesh faces
  for ( ftci = 0; ftci < ftc_count; ftci++ )
  {
    const ON__CMeshFaceTC& ftc_local = ftc_list[ftci];
    int* meshFvi = mesh.m_F[ftc_local.fi].vi;

    if ( ftc_local.bSetT[0] )
    {
      helper.ChangeTextureCoordinate(meshFvi,0,ftc_local.Tx[0],ON_UNSET_FLOAT,mesh_T,mesh_T_stride);
    }
    if ( ftc_local.bSetT[1] )
    {
      helper.ChangeTextureCoordinate(meshFvi,1,ftc_local.Tx[1],ON_UNSET_FLOAT,mesh_T,mesh_T_stride);
    }
    if ( ftc_local.bSetT[2] )
    {
      helper.ChangeTextureCoordinate(meshFvi,2,ftc_local.Tx[2],ON_UNSET_FLOAT,mesh_T,mesh_T_stride);
    }
    if ( ftc_local.bSetT[3] )
    {
      helper.ChangeTextureCoordinate(meshFvi,3,ftc_local.Tx[3],ON_UNSET_FLOAT,mesh_T,mesh_T_stride);
    }
  }
}